

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O0

unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::IRInst>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::IRInst>_>_>_>
* __thiscall
mocker::buildInstDefine_abi_cxx11_
          (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::IRInst>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::IRInst>_>_>_>
           *__return_storage_ptr__,mocker *this,FunctionModule *func)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  bool bVar2;
  BasicBlockList *this_00;
  reference this_01;
  InstList *this_02;
  element_type *this_03;
  string *__k;
  mapped_type *this_04;
  shared_ptr<mocker::ir::Addr> local_a8;
  undefined1 local_98 [8];
  shared_ptr<mocker::ir::Reg> p;
  undefined1 local_80 [8];
  shared_ptr<mocker::ir::Reg> dest;
  shared_ptr<mocker::ir::IRInst> *inst;
  const_iterator __end2;
  const_iterator __begin2;
  InstList *__range2;
  BasicBlock *bb;
  const_iterator __end1;
  const_iterator __begin1;
  BasicBlockList *__range1;
  FunctionModule *func_local;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::IRInst>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::IRInst>_>_>_>
  *res;
  
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::IRInst>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::IRInst>_>_>_>
  ::unordered_map(__return_storage_ptr__);
  this_00 = ir::FunctionModule::getBBs_abi_cxx11_((FunctionModule *)this);
  __end1 = std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::
           begin(this_00);
  bb = (BasicBlock *)
       std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::end
                 (this_00);
  do {
    bVar2 = std::operator!=(&__end1,(_Self *)&bb);
    if (!bVar2) {
      return __return_storage_ptr__;
    }
    this_01 = std::_List_const_iterator<mocker::ir::BasicBlock>::operator*(&__end1);
    this_02 = ir::BasicBlock::getInsts_abi_cxx11_(this_01);
    __end2 = std::__cxx11::
             list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
             ::begin(this_02);
    inst = (shared_ptr<mocker::ir::IRInst> *)
           std::__cxx11::
           list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
           ::end(this_02);
    while (bVar2 = std::operator!=(&__end2,(_Self *)&inst), bVar2) {
      dest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator*(&__end2);
      ir::getDest((ir *)local_80,
                  (shared_ptr<mocker::ir::IRInst> *)
                  dest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi);
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_80);
      if (bVar2) {
        std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>
                  (&local_a8,(shared_ptr<mocker::ir::Reg> *)local_80);
        ir::dycLocalReg((ir *)local_98,&local_a8);
        std::shared_ptr<mocker::ir::Addr>::~shared_ptr(&local_a8);
        bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_98);
        _Var1 = dest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        if (!bVar2) {
          __assert_fail("p",
                        "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/helper.cpp"
                        ,0x11,
                        "std::unordered_map<std::string, std::shared_ptr<ir::IRInst>> mocker::buildInstDefine(const ir::FunctionModule &)"
                       );
        }
        this_03 = std::
                  __shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_98);
        __k = ir::Reg::getIdentifier_abi_cxx11_(this_03);
        this_04 = std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::IRInst>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::IRInst>_>_>_>
                  ::operator[](__return_storage_ptr__,__k);
        std::shared_ptr<mocker::ir::IRInst>::operator=
                  (this_04,(shared_ptr<mocker::ir::IRInst> *)_Var1._M_pi);
        std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_98);
        p.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
             0;
      }
      else {
        p.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
             5;
      }
      std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_80);
      std::_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator++(&__end2);
    }
    std::_List_const_iterator<mocker::ir::BasicBlock>::operator++(&__end1);
  } while( true );
}

Assistant:

std::unordered_map<std::string, std::shared_ptr<ir::IRInst>>
buildInstDefine(const ir::FunctionModule &func) {
  std::unordered_map<std::string, std::shared_ptr<ir::IRInst>> res;

  for (auto &bb : func.getBBs()) {
    for (auto &inst : bb.getInsts()) {
      auto dest = ir::getDest(inst);
      if (!dest)
        continue;
      auto p = ir::dycLocalReg(dest);
      assert(p);
      res[p->getIdentifier()] = inst;
    }
  }

  return res;
}